

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

uint32_t decCheckMath(decNumber *rhs,decContext *set,uint32_t *status)

{
  uint32_t uVar1;
  uint32_t save;
  uint32_t *status_local;
  decContext *set_local;
  decNumber *rhs_local;
  
  uVar1 = *status;
  if (((set->digits < 1000000) && (set->emax < 1000000)) && (-set->emin < 1000000)) {
    if ((((999999 < rhs->digits) || (1000000 < rhs->exponent + rhs->digits)) ||
        (rhs->exponent + rhs->digits < -0x1e847c)) &&
       (((rhs->lsu[0] != '\0' || (rhs->digits != 1)) || ((rhs->bits & 0x70) != 0)))) {
      *status = *status | 0x80;
    }
  }
  else {
    *status = *status | 0x40;
  }
  return (uint32_t)(*status != uVar1);
}

Assistant:

static uInt decCheckMath(const decNumber *rhs, decContext *set,
                         uInt *status) {
  uInt save=*status;                         /* record  */
  if (set->digits>DEC_MAX_MATH
   || set->emax>DEC_MAX_MATH
   || -set->emin>DEC_MAX_MATH) *status|=DEC_Invalid_context;
   else if ((rhs->digits>DEC_MAX_MATH
     || rhs->exponent+rhs->digits>DEC_MAX_MATH+1
     || rhs->exponent+rhs->digits<2*(1-DEC_MAX_MATH))
     && !ISZERO(rhs)) *status|=DEC_Invalid_operation;
  return (*status!=save);
  }